

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O3

void __thiscall
beagle::cpu::EigenDecompositionSquare<double,_1>::updateTransitionMatricesWithModelCategories
          (EigenDecompositionSquare<double,_1> *this,int *eigenIndices,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          double **transitionMatrices,int count)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  double *pdVar6;
  double *pdVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  double *pdVar17;
  long lVar18;
  ulong uVar19;
  double *pdVar20;
  int k;
  ulong uVar21;
  int iVar22;
  double *pdVar23;
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  if (0 < count) {
    uVar14 = (ulong)(uint)(this->super_EigenDecomposition<double,_1>).kCategoryCount;
    uVar11 = 0;
    do {
      if (0 < (int)uVar14) {
        lVar16 = 0;
        iVar22 = 0;
        pdVar6 = transitionMatrices[probabilityIndices[uVar11]];
        uVar9 = (ulong)(uint)(this->super_EigenDecomposition<double,_1>).kStateCount;
        dVar1 = edgeLengths[uVar11];
        do {
          iVar8 = (int)uVar9;
          if (0 < iVar8) {
            iVar12 = 0;
            iVar5 = eigenIndices[lVar16];
            pdVar17 = this->gIMatrices[iVar5];
            pdVar23 = this->gEMatrices[iVar5];
            pdVar20 = (this->super_EigenDecomposition<double,_1>).gEigenValues[iVar5];
            do {
              if (this->isComplex == true) {
                dVar25 = pdVar20[(long)iVar8 + (long)iVar12];
                if ((dVar25 == 0.0) && (!NAN(dVar25))) goto LAB_0012d4a0;
                iVar13 = iVar12 + 1;
                dVar26 = exp(dVar1 * pdVar20[iVar12]);
                dVar27 = cos(dVar1 * dVar25);
                dVar25 = sin(dVar1 * dVar25);
                iVar5 = (this->super_EigenDecomposition<double,_1>).kStateCount;
                uVar9 = (ulong)iVar5;
                if (0 < (long)uVar9) {
                  pdVar7 = (this->super_EigenDecomposition<double,_1>).matrixTmp;
                  lVar10 = (long)(iVar5 * iVar13);
                  lVar18 = (long)(iVar12 * iVar5);
                  uVar14 = 0;
                  auVar24._8_8_ = 0x8000000000000000;
                  auVar24._0_8_ = 0x8000000000000000;
                  auVar28._8_8_ = 0;
                  auVar28._0_8_ = dVar26 * dVar25;
                  auVar24 = vxorpd_avx512vl(auVar28,auVar24);
                  do {
                    auVar2._8_8_ = 0;
                    auVar2._0_8_ = pdVar17[lVar18 + uVar14];
                    auVar29._8_8_ = 0;
                    auVar29._0_8_ = dVar26 * dVar27;
                    auVar31._8_8_ = 0;
                    auVar31._0_8_ = dVar26 * dVar25 * pdVar17[lVar10 + uVar14];
                    auVar28 = vfmadd231sd_fma(auVar31,auVar29,auVar2);
                    pdVar7[lVar18 + uVar14] = auVar28._0_8_;
                    auVar3._8_8_ = 0;
                    auVar3._0_8_ = pdVar17[lVar10 + uVar14];
                    auVar32._8_8_ = 0;
                    auVar32._0_8_ = auVar24._0_8_ * pdVar17[lVar18 + uVar14];
                    auVar28 = vfmadd231sd_fma(auVar32,auVar29,auVar3);
                    pdVar7[lVar10 + uVar14] = auVar28._0_8_;
                    uVar14 = uVar14 + 1;
                  } while (uVar9 != uVar14);
                }
              }
              else {
LAB_0012d4a0:
                dVar25 = exp(dVar1 * pdVar20[iVar12]);
                iVar5 = (this->super_EigenDecomposition<double,_1>).kStateCount;
                uVar9 = (ulong)iVar5;
                iVar13 = iVar12;
                if (0 < (long)uVar9) {
                  uVar14 = 0;
                  lVar10 = (long)(iVar5 * iVar12);
                  pdVar7 = (this->super_EigenDecomposition<double,_1>).matrixTmp;
                  do {
                    pdVar7[lVar10 + uVar14] = dVar25 * pdVar17[lVar10 + uVar14];
                    uVar14 = uVar14 + 1;
                  } while (uVar9 != uVar14);
                }
              }
              iVar12 = iVar13 + 1;
            } while (iVar12 < (int)uVar9);
            if (0 < (int)uVar9) {
              uVar14 = uVar9 & 0xffffffff;
              uVar15 = 0;
              do {
                pdVar17 = (this->super_EigenDecomposition<double,_1>).matrixTmp;
                uVar19 = 0;
                lVar10 = (long)iVar22;
                do {
                  lVar18 = lVar10;
                  auVar24 = ZEXT816(0) << 0x40;
                  uVar21 = 0;
                  pdVar20 = pdVar17;
                  do {
                    auVar30._8_8_ = 0;
                    auVar30._0_8_ = pdVar23[uVar21];
                    uVar21 = uVar21 + 1;
                    auVar4._8_8_ = 0;
                    auVar4._0_8_ = *pdVar20;
                    auVar24 = vfmadd231sd_fma(auVar24,auVar30,auVar4);
                    pdVar20 = pdVar20 + uVar14;
                  } while (uVar14 != uVar21);
                  auVar24 = vmaxsd_avx(auVar24,ZEXT816(0) << 0x40);
                  uVar19 = uVar19 + 1;
                  pdVar17 = pdVar17 + 1;
                  pdVar6[lVar18] = auVar24._0_8_;
                  lVar10 = lVar18 + 1;
                } while (uVar19 != uVar14);
                iVar22 = (int)lVar18 + 2;
                uVar15 = uVar15 + 1;
                pdVar23 = pdVar23 + uVar14;
                pdVar6[(int)(lVar18 + 1)] = 1.0;
              } while (uVar15 != uVar14);
            }
          }
          uVar14 = (ulong)(this->super_EigenDecomposition<double,_1>).kCategoryCount;
          lVar16 = lVar16 + 1;
        } while (lVar16 < (long)uVar14);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uint)count);
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatricesWithModelCategories(int* eigenIndices,
                                                        const int* probabilityIndices,
                                                        const int* firstDerivativeIndices,
                                                        const int* secondDerivativeIndices,
                                                        const double* edgeLengths,
                                                        REALTYPE** transitionMatrices,
                                                        int count) {

    for (int u = 0; u < count; u++) {
        REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
        const double edgeLength = edgeLengths[u];
        int n = 0;
        for (int l = 0; l < kCategoryCount; l++) {
            const REALTYPE distance = edgeLength;
            const REALTYPE* Ievc = gIMatrices[eigenIndices[l]];
            const REALTYPE* Evec = gEMatrices[eigenIndices[l]];
            const REALTYPE* Eval = gEigenValues[eigenIndices[l]];
            const REALTYPE* EvalImag = Eval + kStateCount;
            for(int i=0; i<kStateCount; i++) {
                if (!isComplex || EvalImag[i] == 0) {
                    const REALTYPE tmp = exp(Eval[i] * distance);
                    for(int j=0; j<kStateCount; j++) {
                        matrixTmp[i*kStateCount+j] = Ievc[i*kStateCount+j] * tmp;
                    }
                } else {
                    // 2 x 2 conjugate block
                    int i2 = i + 1;
                    const REALTYPE b = EvalImag[i];
                    const REALTYPE expat = exp(Eval[i] * distance);
                    const REALTYPE expatcosbt = expat * cos(b * distance);
                    const REALTYPE expatsinbt = expat * sin(b * distance);
                    for(int j=0; j<kStateCount; j++) {
                        matrixTmp[ i*kStateCount+j] = expatcosbt * Ievc[ i*kStateCount+j] +
                                                      expatsinbt * Ievc[i2*kStateCount+j];
                        matrixTmp[i2*kStateCount+j] = expatcosbt * Ievc[i2*kStateCount+j] -
                                                      expatsinbt * Ievc[ i*kStateCount+j];
                    }
                    i++; // processed two conjugate rows
                }
            }

#ifdef DEBUG_COMPLEX
            fprintf(stderr,"[");
                for(int i=0; i<16; i++)
                    fprintf(stderr," %7.5e,",matrixTmp[i]);
                fprintf(stderr,"] -- complex debug\n");
                exit(0);
#endif


            for (int i = 0; i < kStateCount; i++) {
                for (int j = 0; j < kStateCount; j++) {
                    REALTYPE sum = 0.0;
                    for (int k = 0; k < kStateCount; k++)
                        sum += Evec[i*kStateCount+k] * matrixTmp[k*kStateCount+j];
                    if (sum > 0)
                        transitionMat[n] = sum;
                    else
                        transitionMat[n] = 0;
                    n++;
                }
if (T_PAD != 0) {
                transitionMat[n] = 1.0;
                n += T_PAD;
}
            }
        }

        if (DEBUGGING_OUTPUT) {
            int kMatrixSize = kStateCount * kStateCount;
            fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
            for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
                fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
        }
    }
}